

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CADFile.cpp
# Opt level: O3

void __thiscall CADFile::CADFile(CADFile *this,vector<char,_std::allocator<char>_> *buf)

{
  pointer *ppBVar1;
  pointer *ppBVar2;
  string *psVar3;
  pointer *pppcVar4;
  BRDPartMountingSide BVar5;
  pointer __src;
  pointer pBVar6;
  pointer pBVar7;
  iterator __position;
  iterator __position_00;
  pointer pBVar8;
  BRDFileBase *pBVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  char *pcVar13;
  mapped_type *pmVar14;
  iterator iVar15;
  char *pcVar16;
  char *pcVar17;
  size_t sVar18;
  long *plVar19;
  undefined8 *puVar20;
  BRDPoint *pBVar21;
  undefined8 uVar22;
  byte *pbVar23;
  ulong *puVar24;
  long *plVar25;
  size_type *psVar26;
  BRDPoint BVar27;
  size_t __n;
  ulong uVar28;
  pointer ppcVar29;
  byte *pbVar30;
  byte *pbVar31;
  byte bVar32;
  bool bVar33;
  double dVar34;
  char *p;
  char *arena;
  vector<char_*,_std::allocator<char_*>_> lines;
  BRDPart part;
  string __str;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  parts_id;
  byte *local_1d0;
  undefined8 local_1c8;
  long local_1c0;
  undefined8 uStack_1b8;
  BRDFileBase *local_1b0;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  key_type local_188;
  ulong *local_168;
  long local_160;
  ulong local_158;
  long lStack_150;
  vector<char_*,_std::allocator<char_*>_> local_148;
  long lStack_130;
  undefined1 local_128 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_110;
  char *pcStack_100;
  uint uStack_f8;
  int iStack_f4;
  int iStack_f0;
  BRDPoint BStack_ec;
  ulong *local_d8;
  long local_d0;
  ulong local_c8 [2];
  long *local_b8 [2];
  long local_a8 [2];
  vector<BRDPart,_std::allocator<BRDPart>_> *local_98;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_90;
  vector<BRDNail,std::allocator<BRDNail>> *local_58;
  vector<BRDPin,std::allocator<BRDPin>> *local_50;
  char *local_48;
  char *local_40;
  pointer local_38;
  
  BRDFileBase::BRDFileBase(&this->super_BRDFileBase);
  (this->super_BRDFileBase)._vptr_BRDFileBase = (_func_int **)&PTR__BRDFileBase_0022b3b8;
  uVar28 = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  local_48 = setlocale(1,"C");
  local_1b0 = &this->super_BRDFileBase;
  if (4 < uVar28) {
    sVar18 = (uVar28 + 1) * 3;
    pcVar13 = (char *)calloc(1,sVar18);
    (this->super_BRDFileBase).file_buf = pcVar13;
    if (pcVar13 != (char *)0x0) {
      __src = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_start;
      __n = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)__src;
      if (__n != 0) {
        memmove(pcVar13,__src,__n);
      }
      pcVar13[uVar28] = '\0';
      local_1a8 = (long *)(pcVar13 + uVar28 + 1);
      pcVar13[sVar18 - 1] = '\0';
      local_90._M_buckets = &local_90._M_single_bucket;
      local_90._M_bucket_count = 1;
      local_90._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_90._M_element_count = 0;
      local_90._M_rehash_policy._M_max_load_factor = 1.0;
      local_90._M_rehash_policy._M_next_resize = 0;
      local_90._M_single_bucket = (__node_base_ptr)0x0;
      local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      stringfile(pcVar13,&local_148);
      bVar33 = false;
      local_38 = local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      if (local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pcVar13 = pcVar13 + (sVar18 - 1);
        local_58 = (vector<BRDNail,std::allocator<BRDNail>> *)&local_1b0->nails;
        local_98 = &local_1b0->parts;
        local_50 = (vector<BRDPin,std::allocator<BRDPin>> *)&local_1b0->pins;
        iVar11 = 1;
        ppcVar29 = local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
LAB_00141d93:
        pbVar23 = (byte *)*ppcVar29;
        pbVar30 = pbVar23 + -1;
        do {
          pbVar23 = pbVar23 + 1;
          bVar32 = pbVar30[1];
          pbVar30 = pbVar30 + 1;
          iVar10 = isspace((uint)bVar32);
        } while (iVar10 != 0);
        if (bVar32 != 0) {
          iVar11 = strncmp((char *)pbVar30,"COMP",4);
          if (iVar11 == 0) {
            local_128._0_4_ = 0;
            local_128._4_4_ = 0;
            local_128._8_8_ = &aStack_110;
            local_128._16_8_ = (char *)0x0;
            aStack_110._M_allocated_capacity = aStack_110._M_allocated_capacity & 0xffffffffffffff00
            ;
            iStack_f0 = 0;
            BStack_ec.x = 0;
            BStack_ec.y = 0;
            pcStack_100 = (char *)0x0;
            uStack_f8 = 0;
            iStack_f4 = 0;
            bVar32 = *pbVar30;
            while (pbVar31 = pbVar30, local_1d0 = pbVar30, bVar32 != 0) {
              iVar11 = isspace((uint)bVar32);
              if (iVar11 == 0) {
                pbVar31 = pbVar23 + -1;
                goto LAB_00141fe3;
              }
              bVar32 = *pbVar23;
              pbVar30 = pbVar23;
              pbVar23 = pbVar23 + 1;
            }
            goto LAB_00142007;
          }
          iVar11 = strncmp((char *)pbVar30,"C_PIN",5);
          if (iVar11 == 0) {
            local_128._0_4_ = 0;
            local_128._4_4_ = 0;
            local_128._8_8_ = (pointer)0x0;
            local_128._16_8_ = local_128._16_8_ & 0xffffffff00000000;
            aStack_110._M_allocated_capacity = 0x1ea23f;
            aStack_110._8_8_ = 0.5;
            pcStack_100 = (char *)0x0;
            uStack_f8 = 0;
            iStack_f4 = 0;
            bVar32 = *pbVar30;
            while (pbVar31 = pbVar30, local_1d0 = pbVar30, bVar32 != 0) {
              iVar11 = isspace((uint)bVar32);
              if (iVar11 == 0) {
                pbVar31 = pbVar23 + -1;
                goto LAB_001424e2;
              }
              bVar32 = *pbVar23;
              pbVar30 = pbVar23;
              pbVar23 = pbVar23 + 1;
            }
            goto LAB_00142506;
          }
          iVar11 = strncmp((char *)pbVar30,"NET ",4);
          if (iVar11 == 0) {
            bVar32 = *pbVar30;
            while (pbVar31 = pbVar30, local_1d0 = pbVar30, bVar32 != 0) {
              iVar11 = isspace((uint)bVar32);
              if (iVar11 == 0) {
                pbVar31 = pbVar23 + -1;
                goto LAB_0014283a;
              }
              bVar32 = *pbVar23;
              pbVar30 = pbVar23;
              pbVar23 = pbVar23 + 1;
            }
            goto LAB_0014285e;
          }
          iVar10 = strncmp((char *)pbVar30,"N_VIA",5);
          iVar11 = 0;
          if (iVar10 != 0) goto LAB_00142acf;
          local_128._0_4_ = 0;
          local_128._4_4_ = 0;
          local_128._8_8_ = (pointer)0x0;
          bVar32 = *pbVar30;
          local_128._16_8_ = local_40;
          while (pbVar31 = pbVar30, local_1d0 = pbVar30, bVar32 != 0) {
            iVar11 = isspace((uint)bVar32);
            if (iVar11 == 0) {
              pbVar31 = pbVar23 + -1;
              goto LAB_00142941;
            }
            bVar32 = *pbVar23;
            pbVar30 = pbVar23;
            pbVar23 = pbVar23 + 1;
          }
          goto LAB_00142965;
        }
        goto LAB_00142acf;
      }
      goto LAB_00142ae9;
    }
    local_b8[0] = local_a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/CADFile.cpp"
               ,"");
    plVar19 = (long *)std::__cxx11::string::append((char *)local_b8);
    puVar24 = (ulong *)(plVar19 + 2);
    if ((ulong *)*plVar19 == puVar24) {
      local_158 = *puVar24;
      lStack_150 = plVar19[3];
      local_168 = &local_158;
    }
    else {
      local_158 = *puVar24;
      local_168 = (ulong *)*plVar19;
    }
    local_160 = plVar19[1];
    *plVar19 = (long)puVar24;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    local_d8 = local_c8;
    std::__cxx11::string::_M_construct((ulong)&local_d8,'\x02');
    *(undefined2 *)local_d8 = 0x3434;
    uVar28 = 0xf;
    if (local_168 != &local_158) {
      uVar28 = local_158;
    }
    if (uVar28 < (ulong)(local_d0 + local_160)) {
      uVar28 = 0xf;
      if (local_d8 != local_c8) {
        uVar28 = local_c8[0];
      }
      if ((ulong)(local_d0 + local_160) <= uVar28) {
        puVar20 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_168);
        goto LAB_00143146;
      }
    }
    puVar20 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_168,(ulong)local_d8);
LAB_00143146:
    local_1d0 = (byte *)&local_1c0;
    pbVar30 = (byte *)(puVar20 + 2);
    if ((byte *)*puVar20 == pbVar30) {
      local_1c0 = *(long *)pbVar30;
      uStack_1b8 = puVar20[3];
    }
    else {
      local_1c0 = *(long *)pbVar30;
      local_1d0 = (byte *)*puVar20;
    }
    local_1c8 = puVar20[1];
    *puVar20 = pbVar30;
    puVar20[1] = 0;
    *pbVar30 = 0;
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_1d0);
    local_1a8 = &local_198;
    plVar25 = plVar19 + 2;
    if ((long *)*plVar19 == plVar25) {
      local_198 = *plVar25;
      lStack_190 = plVar19[3];
    }
    else {
      local_198 = *plVar25;
      local_1a8 = (long *)*plVar19;
    }
    local_1a0 = plVar19[1];
    *plVar19 = (long)plVar25;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_1a8);
    pppcVar4 = &local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    plVar25 = plVar19 + 2;
    if ((pointer *)*plVar19 == (pointer *)plVar25) {
      local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)*plVar25;
      lStack_130 = plVar19[3];
      local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)pppcVar4;
    }
    else {
      local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)*plVar25;
      local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)*plVar19;
    }
    local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)plVar19[1];
    *plVar19 = (long)plVar25;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_148);
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    psVar26 = (size_type *)(plVar19 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar19 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar26) {
      local_188.field_2._M_allocated_capacity = *psVar26;
      local_188.field_2._8_8_ = plVar19[3];
    }
    else {
      local_188.field_2._M_allocated_capacity = *psVar26;
      local_188._M_dataplus._M_p = (pointer)*plVar19;
    }
    local_188._M_string_length = plVar19[1];
    *plVar19 = (long)psVar26;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_188);
    plVar25 = plVar19 + 2;
    if ((__node_base *)*plVar19 == (__node_base *)plVar25) {
      local_90._M_before_begin._M_nxt = (_Hash_node_base *)*plVar25;
      local_90._M_element_count = plVar19[3];
      local_90._M_buckets = &local_90._M_before_begin._M_nxt;
    }
    else {
      local_90._M_before_begin._M_nxt = (_Hash_node_base *)*plVar25;
      local_90._M_buckets = (__buckets_ptr)*plVar19;
    }
    local_90._M_bucket_count = plVar19[1];
    *plVar19 = (long)plVar25;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    pBVar21 = (BRDPoint *)std::__cxx11::string::append((char *)&local_90);
    BVar27 = (BRDPoint)(pBVar21 + 2);
    if (*pBVar21 == BVar27) {
      local_128._16_8_ = *(undefined8 *)BVar27;
      aStack_110._M_allocated_capacity = (size_type)pBVar21[3];
      local_128._0_8_ = (long)local_128 + 0x10;
    }
    else {
      local_128._16_8_ = *(undefined8 *)BVar27;
      local_128._0_8_ = *pBVar21;
    }
    local_128._8_8_ = pBVar21[1];
    *pBVar21 = BVar27;
    pBVar21[1].x = 0;
    pBVar21[1].y = 0;
    *(undefined1 *)&pBVar21[2].x = 0;
    psVar3 = &local_1b0->error_msg;
    std::__cxx11::string::operator=((string *)psVar3,(string *)local_128);
    if (local_128._0_8_ != (long)local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
    }
    if ((__node_base *)local_90._M_buckets != &local_90._M_before_begin) {
      operator_delete(local_90._M_buckets,
                      (ulong)((long)&(local_90._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    if ((pointer *)
        local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_start != pppcVar4) {
      operator_delete(local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if (local_1d0 != (byte *)&local_1c0) {
      operator_delete(local_1d0,local_1c0 + 1);
    }
    if (local_d8 != local_c8) {
      operator_delete(local_d8,local_c8[0] + 1);
    }
    if (local_168 != &local_158) {
      operator_delete(local_168,local_158 + 1);
    }
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0],local_a8[0] + 1);
    }
    SDL_LogError(1,"%s",(psVar3->_M_dataplus)._M_p);
    return;
  }
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,
             "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/CADFile.cpp"
             ,"");
  plVar19 = (long *)std::__cxx11::string::append((char *)local_b8);
  puVar24 = (ulong *)(plVar19 + 2);
  if ((ulong *)*plVar19 == puVar24) {
    local_158 = *puVar24;
    lStack_150 = plVar19[3];
    local_168 = &local_158;
  }
  else {
    local_158 = *puVar24;
    local_168 = (ulong *)*plVar19;
  }
  local_160 = plVar19[1];
  *plVar19 = (long)puVar24;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct((ulong)&local_d8,'\x02');
  *(undefined2 *)local_d8 = 0x3134;
  uVar28 = 0xf;
  if (local_168 != &local_158) {
    uVar28 = local_158;
  }
  if (uVar28 < (ulong)(local_d0 + local_160)) {
    uVar28 = 0xf;
    if (local_d8 != local_c8) {
      uVar28 = local_c8[0];
    }
    if ((ulong)(local_d0 + local_160) <= uVar28) {
      puVar20 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_168);
      goto LAB_00142d25;
    }
  }
  puVar20 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_168,(ulong)local_d8);
LAB_00142d25:
  local_1d0 = (byte *)&local_1c0;
  pbVar30 = (byte *)(puVar20 + 2);
  if ((byte *)*puVar20 == pbVar30) {
    local_1c0 = *(long *)pbVar30;
    uStack_1b8 = puVar20[3];
  }
  else {
    local_1c0 = *(long *)pbVar30;
    local_1d0 = (byte *)*puVar20;
  }
  local_1c8 = puVar20[1];
  *puVar20 = pbVar30;
  puVar20[1] = 0;
  *pbVar30 = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  local_1a8 = &local_198;
  plVar25 = plVar19 + 2;
  if ((long *)*plVar19 == plVar25) {
    local_198 = *plVar25;
    lStack_190 = plVar19[3];
  }
  else {
    local_198 = *plVar25;
    local_1a8 = (long *)*plVar19;
  }
  local_1a0 = plVar19[1];
  *plVar19 = (long)plVar25;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_1a8);
  local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  plVar25 = plVar19 + 2;
  if ((pointer *)*plVar19 == (pointer *)plVar25) {
    local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*plVar25;
    lStack_130 = plVar19[3];
  }
  else {
    local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*plVar25;
    local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)*plVar19;
  }
  local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)plVar19[1];
  *plVar19 = (long)plVar25;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_148);
  psVar26 = (size_type *)(plVar19 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar19 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar26) {
    local_188.field_2._M_allocated_capacity = *psVar26;
    local_188.field_2._8_8_ = plVar19[3];
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  }
  else {
    local_188.field_2._M_allocated_capacity = *psVar26;
    local_188._M_dataplus._M_p = (pointer)*plVar19;
  }
  local_188._M_string_length = plVar19[1];
  *plVar19 = (long)psVar26;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_188);
  plVar25 = plVar19 + 2;
  if ((__node_base *)*plVar19 == (__node_base *)plVar25) {
    local_90._M_before_begin._M_nxt = (_Hash_node_base *)*plVar25;
    local_90._M_element_count = plVar19[3];
    local_90._M_buckets = &local_90._M_before_begin._M_nxt;
  }
  else {
    local_90._M_before_begin._M_nxt = (_Hash_node_base *)*plVar25;
    local_90._M_buckets = (__buckets_ptr)*plVar19;
  }
  local_90._M_bucket_count = plVar19[1];
  *plVar19 = (long)plVar25;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  pBVar21 = (BRDPoint *)std::__cxx11::string::append((char *)&local_90);
  BVar27 = (BRDPoint)(pBVar21 + 2);
  if (*pBVar21 == BVar27) {
    local_128._16_8_ = *(undefined8 *)BVar27;
    aStack_110._M_allocated_capacity = (size_type)pBVar21[3];
    local_128._0_8_ = (long)local_128 + 0x10;
  }
  else {
    local_128._16_8_ = *(undefined8 *)BVar27;
    local_128._0_8_ = *pBVar21;
  }
  local_128._8_8_ = pBVar21[1];
  *pBVar21 = BVar27;
  pBVar21[1].x = 0;
  pBVar21[1].y = 0;
  *(undefined1 *)&pBVar21[2].x = 0;
  psVar3 = &((BRDFileBase *)&local_1b0->_vptr_BRDFileBase)->error_msg;
  std::__cxx11::string::operator=((string *)psVar3,(string *)local_128);
  if (local_128._0_8_ != (long)local_128 + 0x10) {
    operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
  }
  if ((__node_base *)local_90._M_buckets != &local_90._M_before_begin) {
    operator_delete(local_90._M_buckets,
                    (ulong)((long)&(local_90._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  if ((pointer *)
      local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      &local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data
       ._M_end_of_storage) {
    operator_delete(local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,local_198 + 1);
  }
  if (local_1d0 != (byte *)&local_1c0) {
    operator_delete(local_1d0,local_1c0 + 1);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8,local_c8[0] + 1);
  }
  if (local_168 != &local_158) {
    operator_delete(local_168,local_158 + 1);
  }
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0],local_a8[0] + 1);
  }
  SDL_LogError(1,"%s",(psVar3->_M_dataplus)._M_p);
  return;
  while( true ) {
    bVar32 = *pbVar30;
    pbVar23 = pbVar30 + 1;
    local_1d0 = pbVar30;
    if (bVar32 == 0) break;
LAB_00141fe3:
    pbVar30 = pbVar23;
    iVar11 = isspace((uint)bVar32);
    pbVar23 = pbVar30;
    if (iVar11 != 0) break;
  }
  pbVar30 = pbVar23 + -1;
LAB_00142007:
  *pbVar30 = 0;
  local_1d0 = local_1d0 + 1;
  fix_to_utf8((char *)pbVar31,(char **)&local_1a8,pcVar13);
  bVar32 = *local_1d0;
  pbVar30 = local_1d0;
  while (pbVar23 = pbVar30, local_1d0 = pbVar30, bVar32 != 0) {
    pbVar23 = pbVar30 + 1;
    iVar11 = isspace((uint)bVar32);
    if (iVar11 == 0) goto LAB_00142061;
    pbVar30 = pbVar23;
    bVar32 = *pbVar23;
  }
LAB_00142081:
  *pbVar23 = 0;
  local_1d0 = local_1d0 + 1;
  local_128._0_8_ = fix_to_utf8((char *)pbVar30,(char **)&local_1a8,pcVar13);
  bVar32 = *local_1d0;
  pbVar30 = local_1d0;
  while (pbVar23 = pbVar30, local_1d0 = pbVar30, bVar32 != 0) {
    pbVar23 = pbVar30 + 1;
    iVar11 = isspace((uint)bVar32);
    if (iVar11 == 0) goto LAB_001420e4;
    pbVar30 = pbVar23;
    bVar32 = *pbVar23;
  }
LAB_00142104:
  *pbVar23 = 0;
  local_1d0 = local_1d0 + 1;
  fix_to_utf8((char *)pbVar30,(char **)&local_1a8,pcVar13);
  bVar32 = *local_1d0;
  pbVar30 = local_1d0;
  while (pbVar23 = pbVar30, local_1d0 = pbVar30, bVar32 != 0) {
    pbVar23 = pbVar30 + 1;
    iVar11 = isspace((uint)bVar32);
    if (iVar11 == 0) goto LAB_0014215f;
    pbVar30 = pbVar23;
    bVar32 = *pbVar23;
  }
LAB_0014217f:
  *pbVar23 = 0;
  local_1d0 = local_1d0 + 1;
  fix_to_utf8((char *)pbVar30,(char **)&local_1a8,pcVar13);
  bVar32 = *local_1d0;
  pbVar30 = local_1d0;
  while (pbVar23 = pbVar30, local_1d0 = pbVar30, bVar32 != 0) {
    pbVar23 = pbVar30 + 1;
    iVar11 = isspace((uint)bVar32);
    if (iVar11 == 0) goto LAB_001421da;
    pbVar30 = pbVar23;
    bVar32 = *pbVar23;
  }
LAB_001421fa:
  *pbVar23 = 0;
  local_1d0 = local_1d0 + 1;
  fix_to_utf8((char *)pbVar30,(char **)&local_1a8,pcVar13);
  bVar32 = *local_1d0;
  pbVar30 = local_1d0;
  while (pbVar23 = pbVar30, local_1d0 = pbVar30, bVar32 != 0) {
    pbVar23 = pbVar30 + 1;
    iVar11 = isspace((uint)bVar32);
    if (iVar11 == 0) goto LAB_00142255;
    pbVar30 = pbVar23;
    bVar32 = *pbVar23;
  }
LAB_00142275:
  *pbVar23 = 0;
  local_1d0 = local_1d0 + 1;
  fix_to_utf8((char *)pbVar30,(char **)&local_1a8,pcVar13);
  bVar32 = *local_1d0;
  pbVar30 = local_1d0;
  while (pbVar23 = pbVar30, local_1d0 = pbVar30, bVar32 != 0) {
    pbVar23 = pbVar30 + 1;
    iVar11 = isspace((uint)bVar32);
    if (iVar11 == 0) goto LAB_001422d0;
    pbVar30 = pbVar23;
    bVar32 = *pbVar23;
  }
LAB_001422f0:
  *pbVar23 = 0;
  local_1d0 = local_1d0 + 1;
  fix_to_utf8((char *)pbVar30,(char **)&local_1a8,pcVar13);
  bVar32 = *local_1d0;
  pbVar30 = local_1d0;
  while (pbVar23 = pbVar30, local_1d0 = pbVar30, bVar32 != 0) {
    pbVar23 = pbVar30 + 1;
    iVar11 = isspace((uint)bVar32);
    if (iVar11 == 0) goto LAB_0014234b;
    pbVar30 = pbVar23;
    bVar32 = *pbVar23;
  }
LAB_0014236b:
  *pbVar23 = 0;
  local_1d0 = local_1d0 + 1;
  pcVar16 = fix_to_utf8((char *)pbVar30,(char **)&local_1a8,pcVar13);
  bVar32 = *local_1d0;
  pbVar30 = local_1d0;
  while (pbVar23 = pbVar30, local_1d0 = pbVar30, bVar32 != 0) {
    pbVar23 = pbVar30 + 1;
    iVar11 = isspace((uint)bVar32);
    if (iVar11 == 0) goto LAB_001423c9;
    pbVar30 = pbVar23;
    bVar32 = *pbVar23;
  }
LAB_001423e9:
  *pbVar23 = 0;
  local_1d0 = local_1d0 + 1;
  fix_to_utf8((char *)pbVar30,(char **)&local_1a8,pcVar13);
  uVar12 = 1;
  if (*pcVar16 == '1') {
    uVar12 = (pcVar16[1] == '\0') + 1;
  }
  pcStack_100 = (char *)(ulong)uVar12;
  uStack_f8 = 0;
  std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back(local_98,(value_type *)local_128);
  pBVar6 = (local_1b0->parts).super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pBVar7 = (local_1b0->parts).super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,(char *)local_128._0_8_,(allocator<char> *)&local_168);
  pmVar14 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&local_90,&local_188);
  *pmVar14 = (int)((ulong)((long)pBVar6 - (long)pBVar7) >> 3) * 0x38e38e39;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._8_8_ != &aStack_110) {
    operator_delete((void *)local_128._8_8_,(ulong)(aStack_110._M_allocated_capacity + 1));
  }
  iVar11 = 2;
  goto LAB_00142acf;
  while( true ) {
    bVar32 = *pbVar31;
    pbVar23 = pbVar31 + 1;
    local_1d0 = pbVar31;
    if (bVar32 == 0) break;
LAB_00142061:
    pbVar31 = pbVar23;
    iVar11 = isspace((uint)bVar32);
    pbVar23 = pbVar31;
    if (iVar11 != 0) break;
  }
  pbVar23 = pbVar23 + -1;
  goto LAB_00142081;
  while( true ) {
    bVar32 = *pbVar31;
    pbVar23 = pbVar31 + 1;
    local_1d0 = pbVar31;
    if (bVar32 == 0) break;
LAB_001420e4:
    pbVar31 = pbVar23;
    iVar11 = isspace((uint)bVar32);
    pbVar23 = pbVar31;
    if (iVar11 != 0) break;
  }
  pbVar23 = pbVar23 + -1;
  goto LAB_00142104;
  while( true ) {
    bVar32 = *pbVar31;
    pbVar23 = pbVar31 + 1;
    local_1d0 = pbVar31;
    if (bVar32 == 0) break;
LAB_0014215f:
    pbVar31 = pbVar23;
    iVar11 = isspace((uint)bVar32);
    pbVar23 = pbVar31;
    if (iVar11 != 0) break;
  }
  pbVar23 = pbVar23 + -1;
  goto LAB_0014217f;
  while( true ) {
    bVar32 = *pbVar31;
    pbVar23 = pbVar31 + 1;
    local_1d0 = pbVar31;
    if (bVar32 == 0) break;
LAB_001421da:
    pbVar31 = pbVar23;
    iVar11 = isspace((uint)bVar32);
    pbVar23 = pbVar31;
    if (iVar11 != 0) break;
  }
  pbVar23 = pbVar23 + -1;
  goto LAB_001421fa;
  while( true ) {
    bVar32 = *pbVar31;
    pbVar23 = pbVar31 + 1;
    local_1d0 = pbVar31;
    if (bVar32 == 0) break;
LAB_00142255:
    pbVar31 = pbVar23;
    iVar11 = isspace((uint)bVar32);
    pbVar23 = pbVar31;
    if (iVar11 != 0) break;
  }
  pbVar23 = pbVar23 + -1;
  goto LAB_00142275;
  while( true ) {
    bVar32 = *pbVar31;
    pbVar23 = pbVar31 + 1;
    local_1d0 = pbVar31;
    if (bVar32 == 0) break;
LAB_001422d0:
    pbVar31 = pbVar23;
    iVar11 = isspace((uint)bVar32);
    pbVar23 = pbVar31;
    if (iVar11 != 0) break;
  }
  pbVar23 = pbVar23 + -1;
  goto LAB_001422f0;
  while( true ) {
    bVar32 = *pbVar31;
    pbVar23 = pbVar31 + 1;
    local_1d0 = pbVar31;
    if (bVar32 == 0) break;
LAB_0014234b:
    pbVar31 = pbVar23;
    iVar11 = isspace((uint)bVar32);
    pbVar23 = pbVar31;
    if (iVar11 != 0) break;
  }
  pbVar23 = pbVar23 + -1;
  goto LAB_0014236b;
  while( true ) {
    bVar32 = *pbVar31;
    pbVar23 = pbVar31 + 1;
    local_1d0 = pbVar31;
    if (bVar32 == 0) break;
LAB_001423c9:
    pbVar31 = pbVar23;
    iVar11 = isspace((uint)bVar32);
    pbVar23 = pbVar31;
    if (iVar11 != 0) break;
  }
  pbVar23 = pbVar23 + -1;
  goto LAB_001423e9;
  while( true ) {
    bVar32 = *pbVar30;
    pbVar23 = pbVar30 + 1;
    local_1d0 = pbVar30;
    if (bVar32 == 0) break;
LAB_001424e2:
    pbVar30 = pbVar23;
    iVar11 = isspace((uint)bVar32);
    pbVar23 = pbVar30;
    if (iVar11 != 0) break;
  }
  pbVar30 = pbVar23 + -1;
LAB_00142506:
  *pbVar30 = 0;
  local_1d0 = local_1d0 + 1;
  fix_to_utf8((char *)pbVar31,(char **)&local_1a8,pcVar13);
  bVar32 = *local_1d0;
  pbVar30 = local_1d0;
  while (pbVar23 = pbVar30, local_1d0 = pbVar30, bVar32 != 0) {
    pbVar23 = pbVar30 + 1;
    iVar11 = isspace((uint)bVar32);
    if (iVar11 == 0) goto LAB_00142560;
    pbVar30 = pbVar23;
    bVar32 = *pbVar23;
  }
LAB_00142580:
  *pbVar23 = 0;
  local_1d0 = local_1d0 + 1;
  pcVar16 = fix_to_utf8((char *)pbVar30,(char **)&local_1a8,pcVar13);
  pcVar17 = strchr(pcVar16,0x2d);
  if (pcVar17 != (char *)0x0) {
    *pcVar17 = '\0';
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,pcVar16,(allocator<char> *)&local_168);
  iVar15 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&local_90,&local_188);
  if (iVar15.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
      ._M_cur == (__node_type *)0x0) {
    uVar22 = std::__throw_out_of_range("_Map_base::at");
    if (local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_90);
    BRDFileBase::~BRDFileBase(local_1b0);
    _Unwind_Resume(uVar22);
  }
  local_128._12_4_ =
       *(undefined4 *)
        ((long)iVar15.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
               ._M_cur + 0x28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  dVar34 = strtod((char *)local_1d0,(char **)&local_1d0);
  local_128._0_4_ = (int)(dVar34 * 1000.0);
  dVar34 = strtod((char *)local_1d0,(char **)&local_1d0);
  local_128._4_4_ = (int)(dVar34 * 1000.0);
  strtod((char *)local_1d0,(char **)&local_1d0);
  strtod((char *)local_1d0,(char **)&local_1d0);
  strtod((char *)local_1d0,(char **)&local_1d0);
  bVar32 = *local_1d0;
  pbVar30 = local_1d0;
  while (pbVar23 = pbVar30, local_1d0 = pbVar30, bVar32 != 0) {
    pbVar23 = pbVar30 + 1;
    iVar11 = isspace((uint)bVar32);
    if (iVar11 == 0) goto LAB_001426b7;
    pbVar30 = pbVar23;
    bVar32 = *pbVar23;
  }
LAB_001426d7:
  *pbVar23 = 0;
  local_1d0 = local_1d0 + 1;
  fix_to_utf8((char *)pbVar30,(char **)&local_1a8,pcVar13);
  bVar32 = *local_1d0;
  pbVar30 = local_1d0;
  while (pbVar23 = pbVar30, local_1d0 = pbVar30, bVar32 != 0) {
    pbVar23 = pbVar30 + 1;
    iVar11 = isspace((uint)bVar32);
    if (iVar11 == 0) goto LAB_00142732;
    pbVar30 = pbVar23;
    bVar32 = *pbVar23;
  }
LAB_00142752:
  *pbVar23 = 0;
  local_1d0 = local_1d0 + 1;
  pcVar16 = fix_to_utf8((char *)pbVar30,(char **)&local_1a8,pcVar13);
  pcVar17 = strchr(pcVar16,0x2f);
  if (pcVar17 != (char *)0x0) {
    sVar18 = strlen(pcVar16);
    memmove(pcVar16,pcVar16 + 1,sVar18);
  }
  BVar5 = (local_98->super__Vector_base<BRDPart,_std::allocator<BRDPart>_>)._M_impl.
          super__Vector_impl_data._M_start[local_128._12_4_ - Bottom].mounting_side;
  if (BVar5 < (Top|Bottom)) {
    local_128._16_4_ = BVar5;
  }
  __position._M_current =
       (local_1b0->pins).super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
       super__Vector_impl_data._M_finish;
  aStack_110._M_allocated_capacity = (size_type)pcVar16;
  if (__position._M_current ==
      (local_1b0->pins).super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<BRDPin,std::allocator<BRDPin>>::_M_realloc_insert<BRDPin_const&>
              (local_50,__position,(BRDPin *)local_128);
  }
  else {
    (__position._M_current)->name = (char *)CONCAT44(iStack_f4,uStack_f8);
    (__position._M_current)->radius = (double)aStack_110._8_8_;
    (__position._M_current)->snum = pcStack_100;
    *(undefined8 *)&(__position._M_current)->side = local_128._16_8_;
    (__position._M_current)->net = pcVar16;
    ((__position._M_current)->pos).x = local_128._0_4_;
    ((__position._M_current)->pos).y = local_128._4_4_;
    (__position._M_current)->probe = local_128._8_4_;
    (__position._M_current)->part = local_128._12_4_;
    ppBVar1 = &(local_1b0->pins).super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppBVar1 = *ppBVar1 + 1;
  }
  iVar11 = 3;
  goto LAB_00142acf;
  while( true ) {
    bVar32 = *pbVar31;
    pbVar23 = pbVar31 + 1;
    local_1d0 = pbVar31;
    if (bVar32 == 0) break;
LAB_00142560:
    pbVar31 = pbVar23;
    iVar11 = isspace((uint)bVar32);
    pbVar23 = pbVar31;
    if (iVar11 != 0) break;
  }
  pbVar23 = pbVar23 + -1;
  goto LAB_00142580;
  while( true ) {
    bVar32 = *pbVar31;
    pbVar23 = pbVar31 + 1;
    local_1d0 = pbVar31;
    if (bVar32 == 0) break;
LAB_001426b7:
    pbVar31 = pbVar23;
    iVar11 = isspace((uint)bVar32);
    pbVar23 = pbVar31;
    if (iVar11 != 0) break;
  }
  pbVar23 = pbVar23 + -1;
  goto LAB_001426d7;
  while( true ) {
    bVar32 = *pbVar31;
    pbVar23 = pbVar31 + 1;
    local_1d0 = pbVar31;
    if (bVar32 == 0) break;
LAB_00142732:
    pbVar31 = pbVar23;
    iVar11 = isspace((uint)bVar32);
    pbVar23 = pbVar31;
    if (iVar11 != 0) break;
  }
  pbVar23 = pbVar23 + -1;
  goto LAB_00142752;
  while( true ) {
    bVar32 = *pbVar30;
    pbVar23 = pbVar30 + 1;
    local_1d0 = pbVar30;
    if (bVar32 == 0) break;
LAB_0014283a:
    pbVar30 = pbVar23;
    iVar11 = isspace((uint)bVar32);
    pbVar23 = pbVar30;
    if (iVar11 != 0) break;
  }
  pbVar30 = pbVar23 + -1;
LAB_0014285e:
  *pbVar30 = 0;
  local_1d0 = local_1d0 + 1;
  fix_to_utf8((char *)pbVar31,(char **)&local_1a8,pcVar13);
  bVar32 = *local_1d0;
  pbVar30 = local_1d0;
  while (pbVar23 = pbVar30, local_1d0 = pbVar30, bVar32 != 0) {
    pbVar23 = pbVar30 + 1;
    iVar11 = isspace((uint)bVar32);
    if (iVar11 == 0) goto LAB_001428b9;
    pbVar30 = pbVar23;
    bVar32 = *pbVar23;
  }
LAB_001428da:
  *pbVar23 = 0;
  local_1d0 = local_1d0 + 1;
  pcVar16 = fix_to_utf8((char *)pbVar30,(char **)&local_1a8,pcVar13);
  pcVar17 = strchr(pcVar16,0x2f);
  iVar11 = 4;
  local_40 = pcVar16;
  if (pcVar17 != (char *)0x0) {
    sVar18 = strlen(pcVar16);
    memmove(pcVar16,pcVar16 + 1,sVar18);
  }
  goto LAB_00142acf;
  while( true ) {
    bVar32 = *pbVar31;
    pbVar23 = pbVar31 + 1;
    local_1d0 = pbVar31;
    if (bVar32 == 0) break;
LAB_001428b9:
    pbVar31 = pbVar23;
    iVar11 = isspace((uint)bVar32);
    pbVar23 = pbVar31;
    if (iVar11 != 0) break;
  }
  pbVar23 = pbVar23 + -1;
  goto LAB_001428da;
  while( true ) {
    bVar32 = *pbVar30;
    pbVar23 = pbVar30 + 1;
    local_1d0 = pbVar30;
    if (bVar32 == 0) break;
LAB_00142941:
    pbVar30 = pbVar23;
    iVar11 = isspace((uint)bVar32);
    pbVar23 = pbVar30;
    if (iVar11 != 0) break;
  }
  pbVar30 = pbVar23 + -1;
LAB_00142965:
  *pbVar30 = 0;
  local_1d0 = local_1d0 + 1;
  fix_to_utf8((char *)pbVar31,(char **)&local_1a8,pcVar13);
  dVar34 = strtod((char *)local_1d0,(char **)&local_1d0);
  local_128._4_4_ = (int)(dVar34 * 1000.0);
  dVar34 = strtod((char *)local_1d0,(char **)&local_1d0);
  local_128._8_4_ = (int)(dVar34 * 1000.0);
  bVar32 = *local_1d0;
  pbVar30 = local_1d0;
  while (pbVar23 = pbVar30, local_1d0 = pbVar30, bVar32 != 0) {
    pbVar23 = pbVar30 + 1;
    iVar11 = isspace((uint)bVar32);
    if (iVar11 == 0) goto LAB_00142a08;
    pbVar30 = pbVar23;
    bVar32 = *pbVar23;
  }
LAB_00142a28:
  *pbVar23 = 0;
  local_1d0 = local_1d0 + 1;
  fix_to_utf8((char *)pbVar30,(char **)&local_1a8,pcVar13);
  dVar34 = strtod((char *)local_1d0,(char **)&local_1d0);
  local_128._12_4_ = (dVar34 == 1.0) + 1;
  strtod((char *)local_1d0,(char **)&local_1d0);
  __position_00._M_current =
       (local_1b0->nails).super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (local_1b0->nails).super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<BRDNail,std::allocator<BRDNail>>::_M_realloc_insert<BRDNail_const&>
              (local_58,__position_00,(BRDNail *)local_128);
  }
  else {
    (__position_00._M_current)->net = (char *)local_128._16_8_;
    (__position_00._M_current)->probe = local_128._0_4_;
    ((__position_00._M_current)->pos).x = local_128._4_4_;
    *(undefined8 *)&((__position_00._M_current)->pos).y = local_128._8_8_;
    ppBVar2 = &(local_1b0->nails).super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppBVar2 = *ppBVar2 + 1;
  }
  iVar11 = 5;
LAB_00142acf:
  ppcVar29 = ppcVar29 + 1;
  if (ppcVar29 == local_38) goto code_r0x00142ae1;
  goto LAB_00141d93;
  while( true ) {
    bVar32 = *pbVar31;
    pbVar23 = pbVar31 + 1;
    local_1d0 = pbVar31;
    if (bVar32 == 0) break;
LAB_00142a08:
    pbVar31 = pbVar23;
    iVar11 = isspace((uint)bVar32);
    pbVar23 = pbVar31;
    if (iVar11 != 0) break;
  }
  pbVar23 = pbVar23 + -1;
  goto LAB_00142a28;
code_r0x00142ae1:
  bVar33 = iVar11 != 1;
LAB_00142ae9:
  gen_outline((CADFile *)local_1b0);
  pBVar9 = local_1b0;
  pBVar8 = (local_1b0->format).super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_1b0->num_parts =
       (int)((ulong)((long)(local_1b0->parts).super__Vector_base<BRDPart,_std::allocator<BRDPart>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(local_1b0->parts).super__Vector_base<BRDPart,_std::allocator<BRDPart>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
  local_1b0->num_pins =
       (int)((ulong)((long)(local_1b0->pins).super__Vector_base<BRDPin,_std::allocator<BRDPin>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(local_1b0->pins).super__Vector_base<BRDPin,_std::allocator<BRDPin>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249;
  local_1b0->num_format =
       (uint)((ulong)((long)pBVar8 -
                     (long)(local_1b0->format).
                           super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 3);
  local_1b0->num_nails =
       (int)((ulong)((long)(local_1b0->nails).super__Vector_base<BRDNail,_std::allocator<BRDNail>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(local_1b0->nails).super__Vector_base<BRDNail,_std::allocator<BRDNail>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  setlocale(1,local_48);
  pBVar9->valid = bVar33;
  if (local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_90);
  return;
}

Assistant:

CADFile::CADFile(std::vector<char> &buf) {
	auto buffer_size = buf.size();
	float multiplier = 1000.0f;
	char *saved_locale;
	saved_locale  = setlocale(LC_NUMERIC, "C"); // Use '.' as delimiter for strtod

	ENSURE_OR_FAIL(buffer_size > 4, error_msg, return);
	size_t file_buf_size = 3 * (1 + buffer_size);
	file_buf             = (char *)calloc(1, file_buf_size);
	ENSURE_OR_FAIL(file_buf != nullptr, error_msg, return);

	std::copy(buf.begin(), buf.end(), file_buf);
	file_buf[buffer_size] = 0;
	// This is for fixing degenerate utf8
	char *arena     = &file_buf[buffer_size + 1];
	char *arena_end = file_buf + file_buf_size - 1;
	*arena_end      = 0;

	enum Block current_block = None;
	std::unordered_map<std::string, int> parts_id; // map between part name and part number
	char *nailnet; // Net name for VIA

	std::vector<char *> lines;
	stringfile(file_buf, lines);

	for (char *line : lines) {
		while (isspace((uint8_t)*line)) line++;
		if (!line[0]) continue;

			if (!strncmp(line, "COMP", 4)) {
				current_block = Parts;
			} else if (!strncmp(line, "C_PIN", 5)) {
				current_block = Pins;
			} else if (!strncmp(line, "NET ", 4)) {
				current_block = Nets;
			} else if (!strncmp(line, "N_VIA", 5)) {
				current_block = Vias;
			} else {
				current_block = Invalid;
				continue;
			}
		char *p = line;
		char *s;

		switch (current_block) {
			case Parts: {
				BRDPart part;
				BRDPin pin;
				/*char *TYPE    =*/READ_STR();
				part.name       = READ_STR();
				/*char *Part(NR)=*/READ_STR();
				/*char *Unknown =*/READ_STR();
				/*char *Unknown =*/READ_STR();
				/*char *X       =*/READ_STR();
				/*char *Y       =*/READ_STR();
				char *loc       = READ_STR();
				/*int *Unknown  =*/READ_STR();
				part.part_type  = BRDPartType::SMD;
				if (!strcmp(loc, "1"))//top 1 bot 2
					part.mounting_side = BRDPartMountingSide::Top; // SMD part on top
				else
					part.mounting_side = BRDPartMountingSide::Bottom; // SMD part on bottom
				part.end_of_pins       = 0;
				parts.push_back(part);
				parts_id[part.name] = parts.size();
			} break;
			case Pins: {
				BRDPin pin;
				/*char *TYPE  =*/READ_STR();
				char *part    = READ_STR();
				char *ptr;
				ptr = strchr(part, '-'); //remove all after
				if (ptr != NULL)         //
					{*ptr = '\0';}       //
				pin.part       = parts_id.at(part);
				double posx    = READ_DOUBLE();
				pin.pos.x      = posx * multiplier;
				double posy    = READ_DOUBLE();
				pin.pos.y      = posy * multiplier;
				/*int *Unknown =*/READ_DOUBLE();
				/*int *Unknown =*/READ_DOUBLE();
				/*int *Unknown =*/READ_DOUBLE();
				/*int *Unknown =*/READ_STR();
				char *netr     = READ_STR();
				if (strchr(netr, '/'))
					memmove(&netr[0],
					&netr[0 + 1],
					strlen(netr));
				pin.net        = netr;
				switch (parts[pin.part - 1].mounting_side) {
					case BRDPartMountingSide::Top:    pin.side = BRDPinSide::Top;    break;
					case BRDPartMountingSide::Bottom: pin.side = BRDPinSide::Bottom; break;
					case BRDPartMountingSide::Both:   pin.side = BRDPinSide::Both;   break;
				}
				pins.push_back(pin);
			} break;
			case Nets: {
				/*char *TYPE  =*/READ_STR();
				char *netr     = READ_STR();
				if (strchr(netr, '/'))
					memmove(&netr[0],
					&netr[0 + 1],
					strlen(netr));
				nailnet        = netr;
			} break;
			case Vias: {
				BRDNail nail;
				nail.net     = nailnet;
				/*STR *TYPE  =*/READ_STR();
				double posx  = READ_DOUBLE();
				nail.pos.x   = posx * multiplier;
				double posy  = READ_DOUBLE();
				nail.pos.y   = posy * multiplier;
				/*STR        =*/READ_STR();
				nail.side    = READ_DOUBLE() == 1 ? BRDPartMountingSide::Top : BRDPartMountingSide::Bottom;
				/*double     =*/READ_DOUBLE();
				nails.push_back(nail);
			} break;
			default: continue;
		}
	}
	gen_outline();
	num_parts  = parts.size();
	num_pins   = pins.size();
	num_format = format.size();
	num_nails  = nails.size();

	setlocale(LC_NUMERIC, saved_locale); // Restore locale

	valid = current_block != None;
}